

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids::~IfcArbitraryProfileDefWithVoids
          (IfcArbitraryProfileDefWithVoids *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined ***)
   ((long)&(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper +
   (long)p_Var2) = &PTR__IfcArbitraryProfileDefWithVoids_008561e0;
  *(undefined ***)(&this->field_0x98 + (long)p_Var2) =
       &PTR__IfcArbitraryProfileDefWithVoids_00856258;
  *(undefined ***)
   (&(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.field_0x58 + (long)p_Var2) =
       &PTR__IfcArbitraryProfileDefWithVoids_00856208;
  *(undefined ***)(&(this->super_IfcArbitraryClosedProfileDef).field_0x70 + (long)p_Var2) =
       &PTR__IfcArbitraryProfileDefWithVoids_00856230;
  pvVar3 = *(void **)(&(this->super_IfcArbitraryClosedProfileDef).field_0x80 + (long)p_Var2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(p_Var1 + 0x90) - (long)pvVar3);
  }
  *(undefined8 *)p_Var1 = 0x856370;
  *(undefined8 *)(p_Var1 + 0x98) = 0x856398;
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30),*(long *)(p_Var1 + 0x40) + 1);
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10),*(long *)(p_Var1 + 0x20) + 1);
    return;
  }
  return;
}

Assistant:

IfcArbitraryProfileDefWithVoids() : Object("IfcArbitraryProfileDefWithVoids") {}